

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

cmServerProtocol *
cmServer::FindMatchingProtocol
          (vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *protocols,int major,
          int minor)

{
  pointer ppcVar1;
  cmServerProtocol *pcVar2;
  int iVar3;
  int extraout_var;
  int extraout_var_00;
  cmServerProtocol *pcVar4;
  int iVar5;
  cmServerProtocol *pcVar6;
  pointer ppcVar7;
  bool bVar8;
  cmServerProtocol *local_38;
  
  ppcVar7 = (protocols->super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (protocols->super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = ppcVar7 == ppcVar1;
  if (bVar8) {
    pcVar6 = (cmServerProtocol *)0x0;
  }
  else {
    pcVar6 = (cmServerProtocol *)0x0;
    do {
      pcVar4 = *ppcVar7;
      iVar3 = (*pcVar4->_vptr_cmServerProtocol[2])(pcVar4);
      iVar5 = 3;
      pcVar2 = local_38;
      if ((iVar3 == major) && (iVar5 = 1, pcVar2 = pcVar4, extraout_var != minor)) {
        if (pcVar6 != (cmServerProtocol *)0x0) {
          (*pcVar6->_vptr_cmServerProtocol[2])(pcVar6);
          iVar5 = 0;
          pcVar2 = local_38;
          if (extraout_var <= extraout_var_00) goto LAB_003c4a69;
        }
        iVar5 = 0;
        pcVar6 = pcVar4;
        pcVar2 = local_38;
      }
LAB_003c4a69:
      local_38 = pcVar2;
      if ((iVar5 != 3) && (iVar5 != 0)) break;
      ppcVar7 = ppcVar7 + 1;
      bVar8 = ppcVar7 == ppcVar1;
    } while (!bVar8);
  }
  pcVar4 = (cmServerProtocol *)0x0;
  if (minor < 0) {
    pcVar4 = pcVar6;
  }
  if (!bVar8) {
    pcVar4 = local_38;
  }
  return pcVar4;
}

Assistant:

cmServerProtocol* cmServer::FindMatchingProtocol(
  const std::vector<cmServerProtocol*>& protocols, int major, int minor)
{
  cmServerProtocol* bestMatch = nullptr;
  for (auto protocol : protocols) {
    auto version = protocol->ProtocolVersion();
    if (major != version.first) {
      continue;
    }
    if (minor == version.second) {
      return protocol;
    }
    if (!bestMatch || bestMatch->ProtocolVersion().second < version.second) {
      bestMatch = protocol;
    }
  }
  return minor < 0 ? bestMatch : nullptr;
}